

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

void FILECleanupStdHandles(void)

{
  HANDLE hObject;
  HANDLE hObject_00;
  HANDLE hObject_01;
  
  hObject_01 = pStdErr;
  hObject_00 = pStdOut;
  hObject = pStdIn;
  if (PAL_InitializeChakraCoreCalled) {
    pStdIn = &DAT_ffffffffffffffff;
    pStdOut = &DAT_ffffffffffffffff;
    pStdErr = &DAT_ffffffffffffffff;
    CloseHandle(hObject);
    CloseHandle(hObject_00);
    CloseHandle(hObject_01);
    return;
  }
  abort();
}

Assistant:

void FILECleanupStdHandles(void)
{
    HANDLE stdin_handle;
    HANDLE stdout_handle;
    HANDLE stderr_handle;

    TRACE("closing standard handles\n");
    stdin_handle = pStdIn;
    stdout_handle = pStdOut;
    stderr_handle = pStdErr;
    pStdIn = INVALID_HANDLE_VALUE;
    pStdOut = INVALID_HANDLE_VALUE;
    pStdErr = INVALID_HANDLE_VALUE;
    CloseHandle(stdin_handle);
    CloseHandle(stdout_handle);
    CloseHandle(stderr_handle);
}